

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  MeshData *this_00;
  DecoderBuffer *in_RSI;
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_RDI;
  reference rVar4;
  undefined1 unaff_retaddr;
  size_type in_stack_00000008;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  uint32_t i;
  RAnsBitDecoder decoder;
  bool last_orientation;
  uint32_t num_orientations;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  byte in_stack_ffffffffffffff6f;
  RAnsBitDecoder *in_stack_ffffffffffffff70;
  DecoderBuffer *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  RAnsBitDecoder *this_01;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar5;
  uint uVar6;
  reference local_60;
  uint local_4c;
  undefined4 local_48;
  RAnsBitDecoder local_38;
  byte local_1d;
  uint local_1c;
  bool local_1;
  
  local_1c = 0;
  uVar2 = DecoderBuffer::bitstream_version(in_RSI);
  if (uVar2 < 0x202) {
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      (in_stack_ffffffffffffff78,(uint *)in_stack_ffffffffffffff70);
    if (!bVar1) {
      local_1 = false;
      goto LAB_00217a55;
    }
  }
  else {
    bVar1 = DecodeVarint<unsigned_int>
                      ((uint *)CONCAT17(in_stack_ffffffffffffff6f,
                                        CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68
                                                )),(DecoderBuffer *)0x21789a);
    if (!bVar1) {
      local_1 = false;
      goto LAB_00217a55;
    }
  }
  if (local_1c == 0) {
    local_1 = false;
  }
  else {
    uVar6 = local_1c;
    this_00 = MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
              ::mesh_data(in_RDI);
    MeshPredictionSchemeData<draco::CornerTable>::corner_table(this_00);
    uVar3 = CornerTable::num_corners((CornerTable *)0x2178e3);
    if (uVar3 < uVar6) {
      local_1 = false;
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::resize
                (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
      local_1d = 1;
      this_01 = &local_38;
      RAnsBitDecoder::RAnsBitDecoder(in_stack_ffffffffffffff70);
      bVar1 = RAnsBitDecoder::StartDecoding
                        (this_01,(DecoderBuffer *)
                                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      rVar4._M_mask = (_Bit_type)in_stack_ffffffffffffff70;
      rVar4._M_p = (_Bit_type *)in_stack_ffffffffffffff78;
      uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
      if (bVar1) {
        for (local_4c = 0; local_4c < local_1c; local_4c = local_4c + 1) {
          bVar1 = RAnsBitDecoder::DecodeNextBit((RAnsBitDecoder *)rVar4._M_mask);
          if (!bVar1) {
            local_1d = (local_1d ^ 0xff) & 1;
          }
          in_stack_ffffffffffffff6f = local_1d;
          rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar6,uVar5),
                             (size_type)this_01);
          local_60 = rVar4;
          std::_Bit_reference::operator=(&local_60,(bool)(in_stack_ffffffffffffff6f & 1));
        }
        RAnsBitDecoder::EndDecoding(&local_38);
        local_1 = PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ::DecodePredictionData
                            ((PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                              *)CONCAT17(in_stack_ffffffffffffff6f,
                                         CONCAT16(in_stack_ffffffffffffff6e,
                                                  in_stack_ffffffffffffff68)),
                             (DecoderBuffer *)0x217a30);
      }
      else {
        local_1 = false;
      }
      local_48 = 1;
      RAnsBitDecoder::~RAnsBitDecoder((RAnsBitDecoder *)0x217a55);
    }
  }
LAB_00217a55:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    DecodePredictionData(DecoderBuffer *buffer) {
  // Decode the delta coded orientations.
  uint32_t num_orientations = 0;
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer->Decode(&num_orientations)) {
      return false;
    }
  } else {
    if (!DecodeVarint(&num_orientations, buffer)) {
      return false;
    }
  }
  if (num_orientations == 0) {
    return false;
  }
  if (num_orientations > this->mesh_data().corner_table()->num_corners()) {
    // We can't have more orientations than the maximum number of decoded
    // values.
    return false;
  }
  orientations_.resize(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    orientations_[i] = last_orientation;
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}